

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

TCGv_vec tcg_const_zeros_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGType type)

{
  uint uVar1;
  TCGv_vec pTVar2;
  TCGOp *pTVar3;
  uintptr_t o;
  
  pTVar2 = tcg_temp_new_vec_aarch64(tcg_ctx,type);
  uVar1 = *(uint *)(pTVar2 + (long)&tcg_ctx->pool_cur);
  pTVar3 = tcg_emit_op_aarch64(tcg_ctx,INDEX_op_dupi_vec);
  *(uint *)pTVar3 = (*(uint *)pTVar3 & 0xffff00ff) + ((uVar1 >> 8) + 0xe00 & 0xf00) + 0x3000;
  pTVar3->args[0] = (TCGArg)(pTVar2 + (long)&tcg_ctx->pool_cur);
  pTVar3->args[1] = 0;
  return pTVar2;
}

Assistant:

TCGv_vec tcg_const_zeros_vec(TCGContext *tcg_ctx, TCGType type)
{
    TCGv_vec ret = tcg_temp_new_vec(tcg_ctx, type);
    do_dupi_vec(tcg_ctx, ret, MO_REG, 0);
    return ret;
}